

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O0

size_t __thiscall indigox::ElectronOpt::Run(ElectronOpt *this)

{
  bool bVar1;
  Score SVar2;
  __shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  runtime_error *this_01;
  element_type *peVar3;
  size_t sVar4;
  long in_RDI;
  size_t res;
  ElectronOpt *in_stack_00000170;
  ElectronOpt *in_stack_00000290;
  ElectronOpt *in_stack_00000b40;
  ElectronOpt *in_stack_ffffffffffffff78;
  LocalOptimisation *in_stack_ffffffffffffff80;
  AStarOptimisation *in_stack_ffffffffffffff88;
  AStarOptimisation *in_stack_ffffffffffffff90;
  ElectronOpt *in_stack_ffffffffffffffa8;
  FPTOptimisation *in_stack_ffffffffffffffb0;
  ElectronOptimisationAlgorithm *in_stack_ffffffffffffffd0;
  shared_ptr<indigox::MolecularGraph> local_28;
  ElectronOpt *in_stack_fffffffffffffff0;
  
  std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::clear
            ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
             0x12c095);
  bVar1 = std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::empty((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)0x12c0a3);
  if (bVar1) {
    LoadScores(in_stack_00000b40);
  }
  if (Options::AssignElectrons::ALGORITHM == LOCAL_OPTIMISATION) {
    in_stack_ffffffffffffffb0 = (FPTOptimisation *)(in_RDI + 0x78);
    operator_new(0xb8);
    algorithm::LocalOptimisation::LocalOptimisation
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::LocalOptimisation>
              ((__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
                *)in_stack_ffffffffffffff90,(LocalOptimisation *)in_stack_ffffffffffffff88);
  }
  else if (Options::AssignElectrons::ALGORITHM == ASTAR) {
    in_stack_ffffffffffffffa8 = (ElectronOpt *)operator_new(0x198);
    algorithm::AStarOptimisation::AStarOptimisation
              (in_stack_ffffffffffffff90,(ElectronOpt *)in_stack_ffffffffffffff88);
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::AStarOptimisation>
              ((__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
                *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    if (Options::AssignElectrons::ALGORITHM != FPT) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Unsupported optimisation algorithm");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
               *)(in_RDI + 0x78);
    operator_new(0x130);
    algorithm::FPTOptimisation::FPTOptimisation(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
    ;
    std::__shared_ptr<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2>
    ::reset<indigox::algorithm::FPTOptimisation>
              (this_00,(FPTOptimisation *)in_stack_ffffffffffffff88);
  }
  std::shared_ptr<indigox::MolecularGraph>::shared_ptr
            (&local_28,(shared_ptr<indigox::MolecularGraph> *)in_stack_ffffffffffffff78);
  SetMolecularGraph((ElectronOpt *)in_stack_ffffffffffffffb0,
                    (shared_ptr<indigox::MolecularGraph> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<indigox::MolecularGraph>::~shared_ptr
            ((shared_ptr<indigox::MolecularGraph> *)0x12c29a);
  DetermineElectronsToAdd(in_stack_fffffffffffffff0);
  DeterminePotentialElectronLocations(in_stack_00000170);
  if (Options::AssignElectrons::ALGORITHM == ASTAR) {
    SortPotentialLocations(in_stack_00000290);
  }
  std::
  __shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12c2ee);
  algorithm::ElectronOptimisationAlgorithm::PopulateMVP2EV(in_stack_ffffffffffffffd0);
  peVar3 = std::
           __shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12c304);
  (*peVar3->_vptr_ElectronOptimisationAlgorithm[2])();
  std::
  __shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12c31b);
  sVar4 = algorithm::ElectronOptimisationAlgorithm::GetResultCount
                    ((ElectronOptimisationAlgorithm *)0x12c323);
  peVar3 = std::
           __shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::ElectronOptimisationAlgorithm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12c336);
  SVar2 = algorithm::ElectronOptimisationAlgorithm::GetResultEnergy(peVar3);
  *(Score *)(in_RDI + 0x88) = SVar2;
  return sVar4;
}

Assistant:

size_t ElectronOpt::Run() {
  possibleLocations_.clear();
  if (scores_.empty()) LoadScores();
  
  switch (opt_::ALGORITHM) {
    case opt_::Algorithm::LOCAL_OPTIMISATION:
      algo_.reset(new algorithm::LocalOptimisation(this));
      break;
    case opt_::Algorithm::ASTAR:
      algo_.reset(new algorithm::AStarOptimisation(this));
      break;
    case opt_::Algorithm::FPT:
      algo_.reset(new algorithm::FPTOptimisation(this));
      break;
      
    default:
      throw std::runtime_error("Unsupported optimisation algorithm");
      break;
  }
  SetMolecularGraph(molGraph_);
  DetermineElectronsToAdd();
  DeterminePotentialElectronLocations();
  if (opt_::ALGORITHM == opt_::Algorithm::ASTAR) SortPotentialLocations();
  algo_->PopulateMVP2EV();
  algo_->Run();
  size_t res = algo_->GetResultCount();
  finalScore_ = algo_->GetResultEnergy();
  return res;
}